

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::writeScene(Application *this,char *filename)

{
  ostream *poVar1;
  char *filename_local;
  Application *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Writing scene to file ");
  poVar1 = std::operator<<(poVar1,filename);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Collada::ColladaWriter::writeScene(this->scene,filename);
  writeSkeleton(this,filename,this->scene);
  return;
}

Assistant:

void Application::writeScene( const char* filename )
{
   cerr << "Writing scene to file " << filename << endl;
   Collada::ColladaWriter::writeScene( *scene, filename );
   writeSkeleton(filename, scene);
}